

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

void __thiscall
GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>::Replace
          (MP<136UL,_GF2::MOGrevlex<136UL>_> *this,size_t pos,size_t posNew)

{
  bool bVar1;
  WW<136UL> *pWVar2;
  size_t in_RDX;
  size_t in_RSI;
  iterator iter;
  list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_> *in_stack_ffffffffffffffc8;
  _Self local_28;
  _Self local_20;
  size_t local_18;
  size_t local_10;
  
  if (in_RSI != in_RDX) {
    local_18 = in_RDX;
    local_10 = in_RSI;
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>::begin
                   (in_stack_ffffffffffffffc8);
    while( true ) {
      local_28._M_node =
           (_List_node_base *)
           std::__cxx11::list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>::end
                     (in_stack_ffffffffffffffc8);
      bVar1 = std::operator!=(&local_20,&local_28);
      if (!bVar1) break;
      pWVar2 = &std::_List_iterator<GF2::MM<136UL>_>::operator->
                          ((_List_iterator<GF2::MM<136UL>_> *)0x182f0b)->super_WW<136UL>;
      bVar1 = WW<136UL>::Test(pWVar2,local_10);
      if (bVar1) {
        pWVar2 = &std::_List_iterator<GF2::MM<136UL>_>::operator->
                            ((_List_iterator<GF2::MM<136UL>_> *)0x182f28)->super_WW<136UL>;
        WW<136UL>::Flip(pWVar2,local_10);
        pWVar2 = &std::_List_iterator<GF2::MM<136UL>_>::operator->
                            ((_List_iterator<GF2::MM<136UL>_> *)0x182f3f)->super_WW<136UL>;
        WW<136UL>::Set(pWVar2,local_18,true);
      }
      std::_List_iterator<GF2::MM<136UL>_>::operator++(&local_20);
    }
    Normalize(this);
  }
  return;
}

Assistant:

void Replace(size_t pos, size_t posNew)
	{	
		if (pos == posNew)
			return;
		for (iterator iter = begin(); iter != end(); ++iter)
			// переменная pos входит в моном *iter?
			if (iter->Test(pos))
				iter->Flip(pos), iter->Set(posNew, 1);
		Normalize();
	}